

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_axis.cpp
# Opt level: O1

void __thiscall
chrono::ChFunctionRotation_axis::ArchiveOUT(ChFunctionRotation_axis *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChFunctionRotation_axis>(marchive);
  ChFunctionRotation::ArchiveOUT(&this->super_ChFunctionRotation,marchive);
  local_38._value = (ChVector<double> *)&this->fangle;
  local_38._name = "fangle";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_38);
  local_38._value = &this->axis;
  local_38._name = "axis";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  return;
}

Assistant:

void ChFunctionRotation_axis::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChFunctionRotation_axis>();
	// serialize parent class
    ChFunctionRotation::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(fangle);
	marchive << CHNVP(axis);
}